

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
::emplace_back<>(SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *this)

{
  EVP_PKEY_CTX *pEVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  EVP_PKEY_CTX *pEVar5;
  pointer puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer puVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  EVP_PKEY_CTX *pEVar13;
  EVP_PKEY_CTX *ctx;
  ulong uVar14;
  
  pEVar13 = (EVP_PKEY_CTX *)(this->data_ + this->len);
  if (this->len != this->cap) {
    *(undefined8 *)pEVar13 = 0x3f;
    *(undefined8 *)(pEVar13 + 8) = 1;
    *(undefined8 *)(pEVar13 + 0x10) = 0;
    *(undefined8 *)(pEVar13 + 0x18) = 0;
    *(undefined1 **)(pEVar13 + 0x10) =
         &boost::unordered::detail::foa::
          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
    uVar10 = 0x1d;
    if (*(long *)(pEVar13 + 0x18) == 0) {
      uVar10 = 0;
    }
    *(undefined8 *)(pEVar13 + 0x20) = uVar10;
    *(undefined8 *)(pEVar13 + 0x28) = 0;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x2aaaaaaaaaaaaaa) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar4 = this->cap;
  if (uVar14 < uVar4 * 2) {
    uVar14 = uVar4 * 2;
  }
  if (0x2aaaaaaaaaaaaaa - uVar4 < uVar4) {
    uVar14 = 0x2aaaaaaaaaaaaaa;
  }
  lVar12 = (long)pEVar13 - (long)this->data_;
  puVar9 = (pointer)operator_new(uVar14 * 0x30);
  *(undefined8 *)((long)puVar9 + lVar12) = 0x3f;
  *(undefined8 *)((long)puVar9 + lVar12 + 8) = 1;
  puVar2 = (undefined8 *)((long)puVar9 + lVar12 + 0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  *(undefined1 **)((long)puVar9 + lVar12 + 0x10) =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  uVar10 = 0x1d;
  if (*(long *)((long)puVar9 + lVar12 + 0x18) == 0) {
    uVar10 = 0;
  }
  *(undefined8 *)((long)puVar9 + lVar12 + 0x20) = uVar10;
  *(undefined8 *)((long)puVar9 + lVar12 + 0x28) = 0;
  pEVar5 = (EVP_PKEY_CTX *)this->data_;
  ctx = (EVP_PKEY_CTX *)this->len;
  lVar11 = (long)ctx * 0x30;
  if (pEVar5 + lVar11 == pEVar13) {
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        pEVar13 = pEVar5 + (long)ctx;
        uVar10 = *(undefined8 *)pEVar13;
        uVar7 = *(undefined8 *)(pEVar13 + 8);
        uVar8 = *(undefined8 *)(pEVar13 + 0x18);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_) = *(undefined8 *)(pEVar13 + 0x10);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_ + 8) = uVar8;
        *(undefined8 *)(ctx + (long)&puVar9->table_) = uVar10;
        *(undefined8 *)(ctx + (long)&puVar9->table_ + 8) = uVar7;
        uVar10 = *(undefined8 *)(pEVar13 + 0x28);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .size_ctrl) = *(undefined8 *)(pEVar13 + 0x20);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .size_ctrl + 8) = uVar10;
        *(undefined8 *)pEVar13 = 0x3f;
        *(undefined8 *)(pEVar13 + 8) = 1;
        *(undefined1 **)(pEVar13 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar13 + 0x18) = 0;
        *(undefined8 *)(pEVar13 + 0x20) = 0;
        *(undefined8 *)(pEVar13 + 0x28) = 0;
        ctx = ctx + 0x30;
      } while (pEVar13 + 0x30 != pEVar5 + lVar11);
    }
  }
  else {
    if (pEVar5 != pEVar13) {
      lVar11 = 0;
      do {
        pEVar1 = pEVar5 + lVar11;
        ctx = pEVar1 + 0x30;
        uVar10 = *(undefined8 *)pEVar1;
        uVar7 = *(undefined8 *)(pEVar1 + 8);
        uVar8 = *(undefined8 *)(pEVar1 + 0x18);
        puVar2 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_ + lVar11);
        *puVar2 = *(undefined8 *)(pEVar1 + 0x10);
        puVar2[1] = uVar8;
        puVar2 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar11);
        *puVar2 = uVar10;
        puVar2[1] = uVar7;
        uVar10 = *(undefined8 *)(pEVar1 + 0x28);
        puVar2 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .size_ctrl.ml + lVar11);
        *puVar2 = *(undefined8 *)(pEVar1 + 0x20);
        puVar2[1] = uVar10;
        *(undefined8 *)pEVar1 = 0x3f;
        *(undefined8 *)(pEVar1 + 8) = 1;
        *(undefined1 **)(pEVar1 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar1 + 0x18) = 0;
        *(undefined8 *)(pEVar1 + 0x20) = 0;
        *(undefined8 *)(pEVar1 + 0x28) = 0;
        lVar11 = lVar11 + 0x30;
      } while (ctx != pEVar13);
    }
    sVar3 = this->len;
    puVar6 = this->data_;
    if ((EVP_PKEY_CTX *)(puVar6 + sVar3) != pEVar13) {
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        pEVar5 = pEVar13 + (long)ctx;
        uVar10 = *(undefined8 *)pEVar5;
        uVar7 = *(undefined8 *)(pEVar5 + 8);
        uVar8 = *(undefined8 *)(pEVar5 + 0x18);
        *(undefined8 *)(ctx + (long)puVar9 + lVar12 + 0x40) = *(undefined8 *)(pEVar5 + 0x10);
        *(undefined8 *)(ctx + (long)puVar9 + lVar12 + 0x40 + 8) = uVar8;
        *(undefined8 *)(ctx + (long)puVar9 + lVar12 + 0x30) = uVar10;
        *(undefined8 *)(ctx + (long)puVar9 + lVar12 + 0x30 + 8) = uVar7;
        uVar10 = *(undefined8 *)(pEVar5 + 0x28);
        *(undefined8 *)(ctx + (long)puVar9 + lVar12 + 0x50) = *(undefined8 *)(pEVar5 + 0x20);
        *(undefined8 *)(ctx + (long)puVar9 + lVar12 + 0x50 + 8) = uVar10;
        *(undefined8 *)pEVar5 = 0x3f;
        *(undefined8 *)(pEVar5 + 8) = 1;
        *(undefined1 **)(pEVar5 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar5 + 0x18) = 0;
        *(undefined8 *)(pEVar5 + 0x20) = 0;
        *(undefined8 *)(pEVar5 + 0x28) = 0;
        ctx = ctx + 0x30;
      } while (pEVar5 + 0x30 != (EVP_PKEY_CTX *)(puVar6 + sVar3));
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar14;
  this->data_ = puVar9;
  return (reference)((long)puVar9 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }